

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

TValue * luaT_gettm(Table *events,TMS event,TString *ename)

{
  TValue *pTVar1;
  
  pTVar1 = luaH_getstr(events,ename);
  if (pTVar1->tt_ == 0) {
    events->flags = events->flags | (byte)(1 << ((byte)event & 0x1f));
    pTVar1 = (TValue *)0x0;
  }
  return pTVar1;
}

Assistant:

const TValue *luaT_gettm (Table *events, TMS event, TString *ename) {
  const TValue *tm = luaH_getstr(events, ename);
  lua_assert(event <= TM_EQ);
  if (ttisnil(tm)) {  /* no tag method? */
    events->flags |= cast_byte(1u<<event);  /* cache this fact */
    return NULL;
  }
  else return tm;
}